

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_coding.c
# Opt level: O2

void WebRtcIsac_EncodeRc(int16_t *RCQ15,Bitstr *streamdata)

{
  short sVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  int index [6];
  
  lVar2 = 0;
  do {
    if (lVar2 == 6) {
      WebRtcIsac_EncHistMulti(streamdata,index,WebRtcIsac_kQArRcCdfPtr,6);
      return;
    }
    uVar3 = (ulong)WebRtcIsac_kQArRcInitIndex[lVar2];
    index[lVar2] = (uint)WebRtcIsac_kQArRcInitIndex[lVar2];
    sVar1 = RCQ15[lVar2];
    uVar4 = uVar3;
    if (WebRtcIsac_kQArBoundaryLevels[uVar3] < sVar1) {
      while ((uVar3 < 0xb && (WebRtcIsac_kQArBoundaryLevels[uVar3 + 1] < sVar1))) {
        uVar3 = uVar3 + 1;
        index[lVar2] = (int)uVar3;
      }
    }
    else {
      do {
        uVar4 = uVar4 - 1;
        if ((int)uVar3 < 1) break;
        index[lVar2] = (int)uVar4;
        uVar3 = (ulong)((int)uVar3 - 1);
      } while (sVar1 < WebRtcIsac_kQArBoundaryLevels[uVar4 & 0xffffffff]);
    }
    RCQ15[lVar2] = WebRtcIsac_kQArRcLevelsPtr[lVar2][(int)uVar3];
    lVar2 = lVar2 + 1;
  } while( true );
}

Assistant:

void WebRtcIsac_EncodeRc(int16_t* RCQ15, Bitstr* streamdata) {
  int k;
  int index[AR_ORDER];

  /* quantize reflection coefficients (add noise feedback?) */
  for (k = 0; k < AR_ORDER; k++) {
    index[k] = WebRtcIsac_kQArRcInitIndex[k];
    // The safe-guards in following while conditions are to suppress gcc 4.8.3
    // warnings, Issue 2888. Otherwise, first and last elements of
    // |WebRtcIsac_kQArBoundaryLevels| are such that the following search
    // *never* cause an out-of-boundary read.
    if (RCQ15[k] > WebRtcIsac_kQArBoundaryLevels[index[k]]) {
      while (index[k] + 1 < NUM_AR_RC_QUANT_BAUNDARY &&
        RCQ15[k] > WebRtcIsac_kQArBoundaryLevels[index[k] + 1]) {
        index[k]++;
      }
    } else {
      while (index[k] > 0 &&
        RCQ15[k] < WebRtcIsac_kQArBoundaryLevels[--index[k]]) ;
    }
    RCQ15[k] = *(WebRtcIsac_kQArRcLevelsPtr[k] + index[k]);
  }

  /* entropy coding of quantization indices */
  WebRtcIsac_EncHistMulti(streamdata, index, WebRtcIsac_kQArRcCdfPtr, AR_ORDER);
}